

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_vbuf.cxx
# Opt level: O2

void __thiscall
xray_re::xr_mesh_vbuf::extend<xray_re::_vector3<float>>
          (xr_mesh_vbuf *this,_vector3<float> **source,size_t new_size)

{
  _vector3<float> *__src;
  size_t sVar1;
  undefined1 auVar2 [16];
  _vector3<float> *__dest;
  ulong uVar3;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = new_size;
  uVar3 = 0xffffffffffffffff;
  if (SUB168(auVar2 * ZEXT816(0xc),8) == 0) {
    uVar3 = SUB168(auVar2 * ZEXT816(0xc),0);
  }
  __dest = (_vector3<float> *)operator_new__(uVar3);
  __src = *source;
  if ((__src != (_vector3<float> *)0x0) &&
     (sVar1 = (this->super_xr_vbuf).super_xr_flexbuf.m_size, sVar1 != 0)) {
    memmove(__dest,__src,sVar1 * 0xc);
  }
  operator_delete(__src,0xc);
  *source = __dest;
  return;
}

Assistant:

void xr_mesh_vbuf::extend(T*& source, size_t new_size)
{
	T* target = new T[new_size];
	if (source)
		copy(source, target, size());
	delete source;
	source = target;
}